

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validateActivationParams(Result *__return_storage_ptr__,ActivationParams *params)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  WeightParamType WVar9;
  char *pcVar10;
  size_t sVar11;
  char cVar12;
  ulong uVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  char cVar16;
  uint uVar17;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  uVar1 = params->_oneof_case_[0];
  uVar13 = (ulong)(uVar1 - 10);
  if (uVar1 - 10 < 0x3e) {
    if ((0x10040100c0300421U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_0037a2a6;
    if (uVar13 == 0xf) {
      if (uVar1 == 0x19) {
        puVar15 = (undefined1 *)(params->NonlinearityType_).prelu_;
      }
      else {
        puVar15 = Specification::_ActivationPReLU_default_instance_;
      }
      puVar15 = (undefined1 *)((ActivationPReLU *)puVar15)->alpha_;
      if ((WeightParams *)puVar15 == (WeightParams *)0x0) {
        puVar15 = Specification::_WeightParams_default_instance_;
      }
      uVar8 = (uint)(0 < (((WeightParams *)puVar15)->floatvalue_).current_size_);
      uVar6 = uVar8 + 1;
      if (*(long *)(((ulong)(((WeightParams *)puVar15)->float16value_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8) == 0) {
        uVar6 = uVar8;
      }
      if (((uVar6 - (*(long *)(((ulong)(((WeightParams *)puVar15)->rawvalue_).tagged_ptr_.ptr_ &
                               0xfffffffffffffffe) + 8) == 0)) + 2) -
          (uint)(*(long *)(((ulong)(((WeightParams *)puVar15)->int8rawvalue_).tagged_ptr_.ptr_ &
                           0xfffffffffffffffe) + 8) == 0) < 2) goto LAB_0037a2a6;
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
      pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_198," has inconsistent weight parameter types.",0x29);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
      goto LAB_0037a697;
    }
    if (uVar13 == 0x3d) {
      if (uVar1 == 0x47) {
        puVar15 = (undefined1 *)(params->NonlinearityType_).parametricsoftplus_;
      }
      else {
        puVar15 = Specification::_ActivationParametricSoftplus_default_instance_;
      }
      puVar14 = (undefined1 *)((ActivationParametricSoftplus *)puVar15)->alpha_;
      if ((WeightParams *)puVar14 == (WeightParams *)0x0) {
        puVar14 = Specification::_WeightParams_default_instance_;
      }
      iVar2 = (((WeightParams *)puVar14)->floatvalue_).current_size_;
      lVar3 = *(long *)(((ulong)(((WeightParams *)puVar14)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar8 = (0 < iVar2) + 1;
      if (lVar3 == 0) {
        uVar8 = (uint)(0 < iVar2);
      }
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar14)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar5 = *(long *)(((ulong)(((WeightParams *)puVar14)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar6 = (uint)(lVar5 == 0);
      uVar8 = (uVar8 - (lVar4 == 0)) + 2;
      cVar12 = '\x04';
      if (uVar8 - uVar6 < 2) {
        cVar12 = '\x05';
        if (uVar8 != uVar6) {
          cVar12 = iVar2 < 1;
        }
        if ((((lVar3 == 0) && (uVar8 != uVar6)) && (iVar2 < 1)) &&
           ((((lVar4 == 0 || (puVar14 == Specification::_WeightParams_default_instance_)) ||
             (cVar12 = '\x02', ((WeightParams *)puVar14)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar5 == 0 || (puVar14 == Specification::_WeightParams_default_instance_)) ||
                    (cVar12 = '\x03',
                    ((WeightParams *)puVar14)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar12 = '\x05';
        }
      }
      puVar15 = (undefined1 *)((ActivationParametricSoftplus *)puVar15)->beta_;
      if ((WeightParams *)puVar15 == (WeightParams *)0x0) {
        puVar15 = Specification::_WeightParams_default_instance_;
      }
      iVar2 = (((WeightParams *)puVar15)->floatvalue_).current_size_;
      lVar3 = *(long *)(((ulong)(((WeightParams *)puVar15)->float16value_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar17 = (0 < iVar2) + 1;
      if (lVar3 == 0) {
        uVar17 = (uint)(0 < iVar2);
      }
      lVar4 = *(long *)(((ulong)(((WeightParams *)puVar15)->rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      lVar5 = *(long *)(((ulong)(((WeightParams *)puVar15)->int8rawvalue_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8);
      uVar7 = (uint)(lVar5 == 0);
      uVar17 = (uVar17 - (lVar4 == 0)) + 2;
      cVar16 = '\x04';
      if (uVar17 - uVar7 < 2) {
        cVar16 = '\x05';
        if (uVar17 != uVar7) {
          cVar16 = iVar2 < 1;
        }
        if ((((lVar3 == 0) && (uVar17 != uVar7)) && (iVar2 < 1)) &&
           ((((lVar4 == 0 || (puVar15 == Specification::_WeightParams_default_instance_)) ||
             (cVar16 = '\x02', ((WeightParams *)puVar15)->quantization_ == (QuantizationParams *)0x0
             )) && (((lVar5 == 0 || (puVar15 == Specification::_WeightParams_default_instance_)) ||
                    (cVar16 = '\x03',
                    ((WeightParams *)puVar15)->quantization_ == (QuantizationParams *)0x0)))))) {
          cVar16 = '\x05';
        }
      }
      if (((1 < uVar8 - uVar6) || (cVar12 != cVar16)) ||
         (WVar9 = valueType((WeightParams *)puVar15), WVar9 == UNSPECIFIED)) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
        pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_198," has inconsistent weight parameter types.",0x29);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
        goto LAB_0037a697;
      }
      goto LAB_0037a2a6;
    }
  }
  if (uVar1 != 5) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Nonlinearity type ",0x12);
    pcVar10 = MLActivationParamsNonlinearityType_Name(params->_oneof_case_[0]);
    sVar11 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,pcVar10,sVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198," is not supported in this version of CoreML.",0x2c);
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1c8);
LAB_0037a697:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
LAB_0037a2a6:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateActivationParams(const Specification::ActivationParams& params) {
    // make sure params fall into expected values for non-recurrent activations
    switch (params.NonlinearityType_case()) {
        case Specification::ActivationParams::NonlinearityTypeCase::kReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLeakyReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kScaledTanh:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoid:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSigmoidHard:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kLinear:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kELU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftplus:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kPReLU:
        {
            if (valueType(params.prelu().alpha()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kParametricSoftplus:
        {
            if (valueType(params.parametricsoftplus().alpha()) != valueType(params.parametricsoftplus().beta()) ||
                valueType(params.parametricsoftplus().alpha()) == UNSPECIFIED ||
                valueType(params.parametricsoftplus().beta()) == UNSPECIFIED) {
                std::stringstream ss;
                ss << "Nonlinearity type ";
                ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
                ss << " has inconsistent weight parameter types.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
            }
            break;
        }
        case Specification::ActivationParams::NonlinearityTypeCase::kThresholdedReLU:
            break;
        case Specification::ActivationParams::NonlinearityTypeCase::kSoftsign:
            break;
        default:
        {
            std::stringstream ss;
            ss << "Nonlinearity type ";
            ss << MLActivationParamsNonlinearityType_Name(static_cast<MLActivationParamsNonlinearityType>(params.NonlinearityType_case()));
            ss << " is not supported in this version of CoreML.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
        }
    }
    return Result();
}